

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ryml_all.hpp
# Opt level: O3

csubstr __thiscall c4::yml::Parser::_scan_to_next_nonempty_line(Parser *this,size_t indentation)

{
  bool bVar1;
  size_t sVar2;
  ro_substr chars;
  basic_substring<const_char> bVar3;
  csubstr cVar4;
  csubstr next_peeked_triml;
  csubstr local_58;
  basic_substring<const_char> local_40;
  
  local_58 = (csubstr)ZEXT816(0);
  while( true ) {
    local_58 = _peek_next_line(this,(this->m_state->pos).super_LineCol.offset);
    local_40 = basic_substring<const_char>::triml(&local_58,' ');
    if ((local_40.len != 0) && (*local_40.str == '#')) break;
    if (indentation <= local_58.len) {
      if (indentation == 0) {
LAB_001df012:
        _advance_to_peeked(this);
        goto LAB_001df027;
      }
      sVar2 = 0;
      while (local_58.str[sVar2] == ' ') {
        sVar2 = sVar2 + 1;
        if (indentation == sVar2) goto LAB_001df012;
      }
    }
    chars.len = 3;
    chars.str = "\t\r\n";
    bVar3 = basic_substring<const_char>::trimr(&local_40,chars);
    if ((bVar3.str != (char *)0x0 && bVar3.len != 0) || (bVar1 = _advance_to_peeked(this), !bVar1))
    break;
  }
  local_58.str = (char *)0x0;
  local_58.len = 0;
LAB_001df027:
  cVar4.len = local_58.len;
  cVar4.str = local_58.str;
  return cVar4;
}

Assistant:

csubstr Parser::_scan_to_next_nonempty_line(size_t indentation)
{
    csubstr next_peeked;
    while(true)
    {
        _c4dbgpf("rscalar: ... curr offset: {} indentation={}", m_state->pos.offset, indentation);
        next_peeked = _peek_next_line(m_state->pos.offset);
        csubstr next_peeked_triml = next_peeked.triml(' ');
        _c4dbgpf("rscalar: ... next peeked line='{}'", next_peeked.trimr("\r\n"));
        if(next_peeked_triml.begins_with('#'))
        {
            _c4dbgp("rscalar: ... first non-space character is #");
            return {};
        }
        else if(next_peeked.begins_with(' ', indentation))
        {
            _c4dbgpf("rscalar: ... begins at same indentation {}, assuming continuation", indentation);
            _advance_to_peeked();
            return next_peeked;
        }
        else   // check for de-indentation
        {
            csubstr trimmed = next_peeked_triml.trimr("\t\r\n");
            _c4dbgpf("rscalar: ... deindented! trimmed='{}'", trimmed);
            if(!trimmed.empty())
            {
                _c4dbgp("rscalar: ... and not empty. bailing out.");
                return {};
            }
        }
        if(!_advance_to_peeked())
        {
            _c4dbgp("rscalar: file finished");
            return {};
        }
    }
    return {};
}